

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

void A_Unblock(AActor *self,bool drop)

{
  bool bVar1;
  uint uVar2;
  FName local_34;
  PClassActor *local_30;
  PClassActor *ti;
  DDropItem *di;
  TFlags<ActorFlag,_unsigned_int> local_18;
  byte local_11;
  AActor *pAStack_10;
  bool drop_local;
  AActor *self_local;
  
  local_11 = drop;
  pAStack_10 = self;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_18,(int)self + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_18);
  if (uVar2 != 0) {
    pAStack_10->Alpha = 1.0;
    pAStack_10->visdir = '\0';
  }
  operator~((int)&di + MF_SHOOTABLE);
  TFlags<ActorFlag,_unsigned_int>::operator&=(&pAStack_10->flags,(Self *)((long)&di + 4));
  if ((pAStack_10->Conversation == (FStrifeDialogueNode *)0x0) ||
     (pAStack_10->Conversation->DropType == (PClassActor *)0x0)) {
    pAStack_10->Conversation = (FStrifeDialogueNode *)0x0;
    if (((local_11 & 1) != 0) &&
       ((bVar1 = DObject::IsKindOf((DObject *)pAStack_10,APlayerPawn::RegistrationInfo.MyClass),
        !bVar1 && (ti = (PClassActor *)AActor::GetDropItems(pAStack_10), ti != (PClassActor *)0x0)))
       ) {
      for (; ti != (PClassActor *)0x0;
          ti = *(PClassActor **)
                &(ti->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                 Align) {
        bVar1 = FName::operator!=((FName *)&(ti->super_PClass).super_PStruct.super_PNamedType.
                                            super_PCompoundType.super_PType.HashNext,NAME_None);
        if (bVar1) {
          FName::FName(&local_34,
                       (FName *)&(ti->super_PClass).super_PStruct.super_PNamedType.
                                 super_PCompoundType.super_PType.HashNext);
          local_30 = PClass::FindActor(&local_34);
          if (local_30 != (PClassActor *)0x0) {
            P_DropItem(pAStack_10,local_30,
                       *(int *)&(ti->super_PClass).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.Symbols.ParentSymbolTable,
                       *(int *)((long)&(ti->super_PClass).super_PStruct.super_PNamedType.
                                       super_PCompoundType.super_PType.HashNext + 4));
          }
        }
      }
    }
  }
  else {
    P_DropItem(pAStack_10,pAStack_10->Conversation->DropType,-1,0x100);
    pAStack_10->Conversation = (FStrifeDialogueNode *)0x0;
  }
  return;
}

Assistant:

void A_Unblock(AActor *self, bool drop)
{
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1.;
		self->visdir = 0;
	}

	self->flags &= ~MF_SOLID;

	// If the actor has a conversation that sets an item to drop, drop that.
	if (self->Conversation != NULL && self->Conversation->DropType != NULL)
	{
		P_DropItem (self, self->Conversation->DropType, -1, 256);
		self->Conversation = NULL;
		return;
	}

	self->Conversation = NULL;

	// If the actor has attached metadata for items to drop, drop those.
	if (drop && !self->IsKindOf (RUNTIME_CLASS (APlayerPawn)))	// [GRB]
	{
		DDropItem *di = self->GetDropItems();

		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					PClassActor *ti = PClass::FindActor(di->Name);
					if (ti != NULL)
					{
						P_DropItem (self, ti, di->Amount, di->Probability);
					}
				}
				di = di->Next;
			}
		}
	}
}